

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void Poly1305_Update(POLY1305 *ctx,uchar *inp,size_t len)

{
  code *pcVar1;
  long lVar2;
  ulong __n;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t num;
  size_t rem;
  poly1305_blocks_f poly1305_blocks_p;
  ulong local_18;
  void *local_10;
  
  pcVar1 = *(code **)(in_RDI + 0xe8);
  lVar2 = *(long *)(in_RDI + 0xe0);
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (lVar2 != 0) {
    local_18 = 0x10 - lVar2;
    if (in_RDX < local_18) {
      memcpy((void *)(in_RDI + 0xd0 + lVar2),in_RSI,in_RDX);
      *(ulong *)(in_RDI + 0xe0) = lVar2 + in_RDX;
      return;
    }
    memcpy((void *)(in_RDI + 0xd0 + lVar2),in_RSI,local_18);
    (*pcVar1)(in_RDI,in_RDI + 0xd0,0x10,1);
    local_10 = (void *)(local_18 + (long)in_RSI);
    local_18 = in_RDX - local_18;
  }
  __n = local_18 & 0xf;
  local_18 = local_18 - __n;
  if (0xf < local_18) {
    (*pcVar1)(in_RDI,local_10,local_18,1);
    local_10 = (void *)(local_18 + (long)local_10);
  }
  if (__n != 0) {
    memcpy((void *)(in_RDI + 0xd0),local_10,__n);
  }
  *(ulong *)(in_RDI + 0xe0) = __n;
  return;
}

Assistant:

void Poly1305_Update(POLY1305 *ctx, const unsigned char *inp, size_t len)
{
#ifdef POLY1305_ASM
    /*
     * As documented, poly1305_blocks is never called with input
     * longer than single block and padbit argument set to 0. This
     * property is fluently used in assembly modules to optimize
     * padbit handling on loop boundary.
     */
    poly1305_blocks_f poly1305_blocks_p = ctx->func.blocks;
#endif
    size_t rem, num;

    if ((num = ctx->num)) {
        rem = POLY1305_BLOCK_SIZE - num;
        if (len >= rem) {
            memcpy(ctx->data + num, inp, rem);
            poly1305_blocks(ctx->opaque, ctx->data, POLY1305_BLOCK_SIZE, 1);
            inp += rem;
            len -= rem;
        } else {
            /* Still not enough data to process a block. */
            memcpy(ctx->data + num, inp, len);
            ctx->num = num + len;
            return;
        }
    }

    rem = len % POLY1305_BLOCK_SIZE;
    len -= rem;

    if (len >= POLY1305_BLOCK_SIZE) {
        poly1305_blocks(ctx->opaque, inp, len, 1);
        inp += len;
    }

    if (rem)
        memcpy(ctx->data, inp, rem);

    ctx->num = rem;
}